

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::blockCheck
          (StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *this)

{
  int iVar1;
  Input **__dest;
  Input **ppIVar2;
  Input *pIVar3;
  ulong uVar4;
  long lVar5;
  
  if (0x1f < this->bsize) {
    iVar1 = this->dataSlotsAvailable;
    lVar5 = (long)iVar1;
    if (lVar5 == 0) {
      ppIVar2 = (Input **)operator_new__(0x200);
      this->dataptr = ppIVar2;
      this->dataSlotsAvailable = 0x40;
      this->dataSlotIndex = -1;
    }
    else if (iVar1 + -1 <= this->dataSlotIndex) {
      uVar4 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar4 = lVar5 << 4;
      }
      __dest = (Input **)operator_new__(uVar4);
      ppIVar2 = this->dataptr;
      memmove(__dest,ppIVar2,lVar5 << 3);
      if (ppIVar2 != (Input **)0x0) {
        operator_delete__(ppIVar2);
      }
      this->dataptr = __dest;
      this->dataSlotsAvailable = this->dataSlotsAvailable << 1;
    }
    iVar1 = this->freeIndex;
    if ((long)iVar1 == 0) {
      pIVar3 = (Input *)operator_new(0x2600);
    }
    else {
      this->freeIndex = iVar1 + -1;
      pIVar3 = this->freeblocks[(long)iVar1 + -1];
    }
    iVar1 = this->dataSlotIndex;
    this->dataSlotIndex = iVar1 + 1;
    this->dataptr[(long)iVar1 + 1] = pIVar3;
    this->bsize = 0;
  }
  return;
}

Assistant:

void blockCheck()
        {
            if (bsize >= static_cast<int>(blockSize)) {
                if (0 == dataSlotsAvailable) {
                    dataptr = new X*[64];
                    dataSlotsAvailable = 64;
                    dataSlotIndex = -1;
                } else if (dataSlotIndex >= dataSlotsAvailable - 1) {
                    auto mem =
                        new X*[static_cast<size_t>(dataSlotsAvailable) * 2];
                    std::copy(dataptr, dataptr + dataSlotsAvailable, mem);
                    delete[] dataptr;
                    dataptr = mem;
                    dataSlotsAvailable *= 2;
                }
                dataptr[++dataSlotIndex] = getNewBlock();
                bsize = 0;
            }
        }